

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

int __thiscall
qclab::QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_>::toQASM
          (QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_> *this,
          ostream *stream,int offset)

{
  QGate1<std::complex<double>_> *pQVar1;
  int iVar2;
  pointer puVar3;
  
  puVar3 = (this->gates_).
           super__Vector_base<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar3 == (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return 0;
    }
    pQVar1 = (puVar3->_M_t).
             super___uniq_ptr_impl<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::QGate1<std::complex<double>_>_*,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::QGate1<std::complex<double>_>_*,_false>.
             _M_head_impl;
    iVar2 = (*(pQVar1->super_QObject<std::complex<double>_>)._vptr_QObject[0xb])
                      (pQVar1,stream,(ulong)(uint)(this->offset_ + offset));
    puVar3 = puVar3 + 1;
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

int toQASM( std::ostream& stream , const int offset = 0 ) const override {
        for ( auto it = begin(); it != end(); ++it ) {
          int out = (*it)->toQASM( stream , offset_ + offset ) ;
          if ( out != 0 ) return out ;
        }
        return 0 ;
      }